

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv64_impl.h
# Opt level: O3

void secp256k1_modinv64_var(secp256k1_modinv64_signed62 *x,secp256k1_modinv64_modinfo *modinfo)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  secp256k1_modinv64_modinfo *psVar5;
  int64_t iVar6;
  int64_t iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  ulong extraout_RAX_05;
  ulong extraout_RAX_06;
  ulong extraout_RAX_07;
  ulong uVar11;
  byte bVar12;
  uint uVar13;
  secp256k1_modinv64_signed62 *psVar14;
  secp256k1_modinv64_signed62 *psVar15;
  uint uVar16;
  ulong *extraout_RDX;
  int64_t *piVar17;
  long lVar18;
  long lVar19;
  int64_t *piVar20;
  long extraout_RDX_00;
  long extraout_RDX_01;
  long extraout_RDX_02;
  long extraout_RDX_03;
  long extraout_RDX_04;
  long extraout_RDX_05;
  long extraout_RDX_06;
  long extraout_RDX_07;
  long extraout_RDX_08;
  secp256k1_modinv64_signed62 *a;
  long *extraout_RDX_09;
  long lVar21;
  long lVar22;
  secp256k1_modinv64_signed62 *b;
  int64_t *unaff_RBX;
  int64_t *piVar23;
  int64_t *unaff_RBP;
  int64_t *piVar24;
  ulong uVar25;
  long lVar26;
  int64_t *a_00;
  secp256k1_modinv64_modinfo *psVar27;
  secp256k1_modinv64_signed62 *psVar28;
  int64_t *piVar29;
  undefined1 *puVar30;
  int64_t *piVar31;
  int64_t *piVar32;
  secp256k1_modinv64_signed62 *psVar33;
  int64_t *piVar34;
  long lVar35;
  secp256k1_modinv64_modinfo *unaff_R12;
  secp256k1_modinv64_modinfo *psVar36;
  secp256k1_modinv64_modinfo *modinfo_00;
  long lVar37;
  ulong uVar38;
  long lVar39;
  secp256k1_modinv64_signed62 *psVar40;
  bool bVar41;
  secp256k1_modinv64_signed62 f;
  secp256k1_modinv64_signed62 g;
  secp256k1_modinv64_trans2x2 t;
  secp256k1_modinv64_signed62 d;
  secp256k1_modinv64_signed62 sStack_240;
  secp256k1_modinv64_signed62 sStack_218;
  int64_t *piStack_1f0;
  int64_t *piStack_1e8;
  secp256k1_modinv64_signed62 *psStack_1e0;
  ulong uStack_1d8;
  int64_t *piStack_1d0;
  ulong uStack_1c8;
  int64_t *piStack_1c0;
  secp256k1_modinv64_signed62 *psStack_1b8;
  int64_t *piStack_1b0;
  long lStack_1a8;
  long lStack_1a0;
  int64_t *piStack_198;
  long lStack_190;
  long lStack_188;
  long lStack_180;
  long lStack_178;
  long lStack_170;
  int64_t *piStack_168;
  int64_t *piStack_160;
  secp256k1_modinv64_modinfo *psStack_158;
  int64_t *piStack_150;
  int64_t *piStack_148;
  long lStack_140;
  int64_t *piStack_138;
  code *pcStack_130;
  uint local_124;
  ulong local_120;
  int64_t *local_118;
  secp256k1_modinv64_modinfo *local_110;
  secp256k1_modinv64_signed62 local_108;
  ulong uStack_e0;
  int64_t *local_d8;
  ulong auStack_d0 [5];
  secp256k1_modinv64_trans2x2 local_a8;
  secp256k1_modinv64_signed62 local_88;
  secp256k1_modinv64_signed62 local_58;
  
  local_88.v[2] = 0;
  local_88.v[3] = 0;
  local_88.v[0] = 0;
  local_88.v[1] = 0;
  local_88.v[4] = 0;
  local_58.v[3] = 0;
  local_58.v[4] = 0;
  local_58.v[1] = 0;
  local_58.v[2] = 0;
  local_58.v[0] = 1;
  local_108.v[4] = (modinfo->modulus).v[4];
  local_108.v[0] = (modinfo->modulus).v[0];
  local_108.v[1] = (modinfo->modulus).v[1];
  local_108.v[2] = (modinfo->modulus).v[2];
  local_108.v[3] = (modinfo->modulus).v[3];
  auStack_d0[3] = x->v[4];
  local_d8 = (int64_t *)x->v[0];
  auStack_d0[0] = x->v[1];
  auStack_d0[1] = x->v[2];
  auStack_d0[2] = x->v[3];
  local_120 = 0;
  lVar39 = -1;
  local_124 = 5;
  local_118 = x->v;
  local_110 = modinfo;
LAB_00149138:
  piVar23 = (int64_t *)local_108.v[0];
  modinfo_00 = local_110;
  psVar5 = (secp256k1_modinv64_modinfo *)0x0;
  piVar29 = (int64_t *)0x0;
  psVar27 = (secp256k1_modinv64_modinfo *)0x1;
  uVar16 = 0x3e;
  piVar24 = (int64_t *)0x1;
  piVar32 = local_d8;
  piVar17 = (int64_t *)local_108.v[0];
  while( true ) {
    a_00 = (int64_t *)(-1L << ((byte)uVar16 & 0x3f) | (ulong)piVar32);
    psVar14 = (secp256k1_modinv64_signed62 *)0x0;
    if (a_00 != (int64_t *)0x0) {
      for (; ((ulong)a_00 >> (long)psVar14 & 1) == 0;
          psVar14 = (secp256k1_modinv64_signed62 *)((long)psVar14->v + 1)) {
      }
    }
    bVar12 = (byte)psVar14;
    piVar31 = (int64_t *)((ulong)piVar32 >> (bVar12 & 0x3f));
    piVar24 = (int64_t *)((long)piVar24 << (bVar12 & 0x3f));
    psVar5 = (secp256k1_modinv64_modinfo *)((long)psVar5 << (bVar12 & 0x3f));
    lVar39 = lVar39 - (long)psVar14;
    uVar16 = uVar16 - (int)psVar14;
    if (uVar16 == 0) break;
    if (((ulong)piVar17 & 1) == 0) {
      pcStack_130 = (code *)0x1495b5;
      secp256k1_modinv64_var_cold_8();
LAB_001495b5:
      pcStack_130 = (code *)0x1495ba;
      secp256k1_modinv64_var_cold_7();
LAB_001495ba:
      pcStack_130 = (code *)0x1495bf;
      secp256k1_modinv64_var_cold_1();
LAB_001495bf:
      pcStack_130 = (code *)0x1495c4;
      secp256k1_modinv64_var_cold_2();
LAB_001495c4:
      pcStack_130 = (code *)0x1495c9;
      secp256k1_modinv64_var_cold_6();
      piVar31 = piVar17;
      goto LAB_001495c9;
    }
    if (((ulong)piVar31 & 1) == 0) goto LAB_001495b5;
    a_00 = (int64_t *)((long)psVar5 * (long)local_d8 + (long)piVar24 * local_108.v[0]);
    psVar14 = (secp256k1_modinv64_signed62 *)(ulong)(0x3e - uVar16);
    bVar12 = (byte)(0x3e - uVar16);
    unaff_RBX = (int64_t *)((long)piVar17 << (bVar12 & 0x3f));
    if (a_00 != unaff_RBX) goto LAB_001495ba;
    unaff_RBX = (int64_t *)((long)psVar27 * (long)local_d8 + (long)piVar29 * local_108.v[0]);
    a_00 = (int64_t *)((long)piVar31 << (bVar12 & 0x3f));
    if (unaff_RBX != a_00) goto LAB_001495bf;
    psVar14 = (secp256k1_modinv64_signed62 *)(lVar39 - 0x2ea);
    if (psVar14 < (secp256k1_modinv64_signed62 *)0xfffffffffffffa2d) goto LAB_001495c4;
    iVar4 = (int)piVar31;
    if (lVar39 < 0) {
      lVar39 = -lVar39;
      uVar13 = (int)lVar39 + 1;
      if ((int)uVar16 <= (int)uVar13) {
        uVar13 = uVar16;
      }
      psVar14 = (secp256k1_modinv64_signed62 *)(ulong)uVar13;
      a_00 = (int64_t *)(ulong)(uVar13 - 0x3f);
      if (0xffffffc1 < uVar13 - 0x3f) {
        psVar36 = (secp256k1_modinv64_modinfo *)-(long)psVar5;
        unaff_RBP = (int64_t *)-(long)piVar24;
        piVar32 = (int64_t *)-(long)piVar17;
        unaff_RBX = (int64_t *)
                    ((ulong)(0x3fL << (-(char)uVar13 & 0x3fU)) >> (-(char)uVar13 & 0x3fU));
        uVar13 = (iVar4 * iVar4 + 0x3e) * iVar4 * (int)piVar32 & (uint)unaff_RBX;
        psVar5 = psVar27;
        piVar24 = piVar29;
        unaff_R12 = psVar36;
        goto LAB_00149294;
      }
      goto LAB_001495d3;
    }
    uVar13 = (int)lVar39 + 1;
    if ((int)uVar16 <= (int)uVar13) {
      uVar13 = uVar16;
    }
    psVar14 = (secp256k1_modinv64_signed62 *)(ulong)uVar13;
    a_00 = (int64_t *)(ulong)(uVar13 - 0x3f);
    if (uVar13 - 0x3f < 0xffffffc2) goto LAB_001495ce;
    unaff_RBX = (int64_t *)((ulong)(0xfL << (-(char)uVar13 & 0x3fU)) >> (-(char)uVar13 & 0x3fU));
    uVar13 = -(iVar4 * (((int)piVar17 * 2 + 2U & 8) + (int)piVar17)) & (uint)unaff_RBX;
    unaff_RBP = piVar29;
    psVar36 = psVar27;
    piVar32 = piVar31;
    piVar31 = piVar17;
LAB_00149294:
    uVar25 = (ulong)uVar13;
    a_00 = (int64_t *)(uVar25 * (long)piVar31);
    piVar32 = (int64_t *)((long)piVar32 + (long)a_00);
    piVar29 = (int64_t *)((long)piVar24 * uVar25 + (long)unaff_RBP);
    psVar14 = (secp256k1_modinv64_signed62 *)(uVar25 * (long)psVar5);
    psVar27 = (secp256k1_modinv64_modinfo *)((long)psVar14->v + (long)&psVar36->modulus);
    piVar17 = piVar31;
    if (((ulong)piVar32 & (ulong)unaff_RBX) != 0) {
LAB_001495c9:
      pcStack_130 = (code *)0x1495ce;
      secp256k1_modinv64_var_cold_4();
      piVar17 = piVar31;
LAB_001495ce:
      pcStack_130 = (code *)0x1495d3;
      secp256k1_modinv64_var_cold_3();
LAB_001495d3:
      pcStack_130 = (code *)0x1495d8;
      secp256k1_modinv64_var_cold_5();
      modinfo_00 = unaff_R12;
      goto LAB_001495d8;
    }
  }
  a_00 = (int64_t *)((long)psVar5 * (long)piVar29);
  psVar14 = SUB168(SEXT816((long)psVar5) * SEXT816((long)piVar29),8);
  local_a8.u = (int64_t)piVar24;
  local_a8.v = (int64_t)psVar5;
  local_a8.q = (int64_t)piVar29;
  local_a8.r = (int64_t)psVar27;
  if ((long)piVar24 * (long)psVar27 - (long)a_00 != 0x4000000000000000 ||
      SUB168(SEXT816((long)piVar24) * SEXT816((long)psVar27),8) - (long)psVar14 !=
      (ulong)((secp256k1_modinv64_signed62 *)((long)piVar24 * (long)psVar27) < a_00))
  goto LAB_0014960f;
  pcStack_130 = (code *)0x149322;
  secp256k1_modinv64_update_de_62(&local_88,&local_58,&local_a8,local_110);
  uVar16 = local_124;
  piVar23 = local_108.v;
  unaff_RBX = (int64_t *)(ulong)local_124;
  piVar24 = (int64_t *)(ulong)local_124;
  psVar14 = (secp256k1_modinv64_signed62 *)0xffffffffffffffff;
  pcStack_130 = (code *)0x14933f;
  a_00 = piVar23;
  iVar4 = secp256k1_modinv64_mul_cmp_62
                    ((secp256k1_modinv64_signed62 *)piVar23,local_124,&modinfo_00->modulus,-1);
  piVar17 = (int64_t *)&local_d8;
  if (0 < iVar4) {
    psVar14 = (secp256k1_modinv64_signed62 *)0x1;
    piVar24 = (int64_t *)(ulong)uVar16;
    pcStack_130 = (code *)0x14935e;
    a_00 = piVar23;
    iVar4 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)piVar23,uVar16,&modinfo_00->modulus,1);
    if (0 < iVar4) goto LAB_001495dd;
    piVar24 = (int64_t *)(ulong)uVar16;
    psVar14 = (secp256k1_modinv64_signed62 *)0xffffffffffffffff;
    pcStack_130 = (code *)0x14937a;
    a_00 = piVar17;
    iVar4 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)piVar17,uVar16,&modinfo_00->modulus,-1);
    if (iVar4 < 1) goto LAB_001495e2;
    psVar14 = (secp256k1_modinv64_signed62 *)0x1;
    piVar24 = (int64_t *)(ulong)uVar16;
    pcStack_130 = (code *)0x149394;
    a_00 = piVar17;
    iVar4 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)piVar17,uVar16,&modinfo_00->modulus,1);
    if (-1 < iVar4) goto LAB_001495e7;
    pcStack_130 = (code *)0x1493b1;
    secp256k1_modinv64_update_fg_62_var
              (uVar16,(secp256k1_modinv64_signed62 *)piVar23,(secp256k1_modinv64_signed62 *)piVar17,
               &local_a8);
    if (local_d8 == (int64_t *)0x0) {
      if (1 < (int)uVar16) {
        uVar25 = 1;
        uVar8 = 0;
        do {
          uVar8 = uVar8 | auStack_d0[uVar25 - 1];
          uVar25 = uVar25 + 1;
        } while (uVar16 != uVar25);
        if (uVar8 != 0) goto LAB_001493e1;
      }
      a_00 = (int64_t *)&local_d8;
      piVar24 = (int64_t *)(ulong)uVar16;
      psVar14 = (secp256k1_modinv64_signed62 *)0x0;
      pcStack_130 = (code *)0x1494c7;
      iVar4 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)a_00,uVar16,&SECP256K1_SIGNED62_ONE,0);
      if (iVar4 != 0) goto LAB_00149605;
      pcStack_130 = (code *)0x1494e9;
      iVar4 = secp256k1_modinv64_mul_cmp_62(&local_108,uVar16,&SECP256K1_SIGNED62_ONE,-1);
      piVar23 = local_118;
      if (iVar4 != 0) {
        pcStack_130 = (code *)0x14950a;
        iVar4 = secp256k1_modinv64_mul_cmp_62(&local_108,uVar16,&SECP256K1_SIGNED62_ONE,1);
        if (iVar4 != 0) {
          piVar24 = (int64_t *)0x5;
          psVar14 = (secp256k1_modinv64_signed62 *)0x0;
          pcStack_130 = (code *)0x149524;
          a_00 = piVar23;
          iVar4 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)piVar23,5,&SECP256K1_SIGNED62_ONE,0);
          if (iVar4 != 0) goto LAB_0014960a;
          a_00 = local_88.v;
          piVar24 = (int64_t *)0x5;
          psVar14 = (secp256k1_modinv64_signed62 *)0x0;
          pcStack_130 = (code *)0x149547;
          iVar4 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)a_00,5,&SECP256K1_SIGNED62_ONE,0);
          if (iVar4 != 0) goto LAB_0014960a;
          a_00 = local_108.v;
          psVar14 = (secp256k1_modinv64_signed62 *)0x1;
          piVar24 = (int64_t *)(ulong)uVar16;
          pcStack_130 = (code *)0x149563;
          iVar4 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)a_00,uVar16,&modinfo_00->modulus,1);
          if (iVar4 != 0) goto LAB_0014960a;
        }
      }
      pcStack_130 = (code *)0x149586;
      secp256k1_modinv64_normalize_62(&local_88,(int64_t)(&local_110)[(int)uVar16],modinfo_00);
      piVar23[4] = local_88.v[4];
      piVar23[2] = local_88.v[2];
      piVar23[3] = local_88.v[3];
      *piVar23 = local_88.v[0];
      piVar23[1] = local_88.v[1];
      return;
    }
LAB_001493e1:
    lVar19 = (long)(int)uVar16;
    psVar5 = (&local_110)[lVar19];
    psVar14 = (secp256k1_modinv64_signed62 *)(&uStack_e0)[lVar19];
    a_00 = (int64_t *)((long)psVar5 >> 0x3f ^ (ulong)psVar5 | lVar19 + -2 >> 0x3f);
    piVar24 = (int64_t *)((long)psVar14 >> 0x3f ^ (ulong)psVar14 | (ulong)a_00);
    if (piVar24 == (int64_t *)0x0) {
      unaff_RBX = (int64_t *)(ulong)(uVar16 - 1);
      (&local_118)[lVar19] = (int64_t *)((ulong)(&local_118)[lVar19] | (long)psVar5 << 0x3e);
      psVar14 = (secp256k1_modinv64_signed62 *)((long)psVar14 << 0x3e);
      local_108.v[lVar19 + 4] = local_108.v[lVar19 + 4] | (ulong)psVar14;
    }
    if ((int)local_120 == 0xb) goto LAB_001495ec;
    uVar16 = (uint)unaff_RBX;
    psVar14 = (secp256k1_modinv64_signed62 *)0xffffffffffffffff;
    pcStack_130 = (code *)0x149445;
    piVar24 = unaff_RBX;
    a_00 = piVar23;
    iVar4 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)piVar23,uVar16,&modinfo_00->modulus,-1);
    if (iVar4 < 1) goto LAB_001495f1;
    psVar14 = (secp256k1_modinv64_signed62 *)0x1;
    pcStack_130 = (code *)0x14945f;
    piVar24 = unaff_RBX;
    a_00 = piVar23;
    iVar4 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)piVar23,uVar16,&modinfo_00->modulus,1);
    if (0 < iVar4) goto LAB_001495f6;
    psVar14 = (secp256k1_modinv64_signed62 *)0xffffffffffffffff;
    pcStack_130 = (code *)0x14947b;
    piVar24 = unaff_RBX;
    a_00 = piVar17;
    iVar4 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)piVar17,uVar16,&modinfo_00->modulus,-1);
    if (iVar4 < 1) goto LAB_001495fb;
    psVar14 = (secp256k1_modinv64_signed62 *)0x1;
    pcStack_130 = (code *)0x149495;
    piVar24 = unaff_RBX;
    a_00 = piVar17;
    iVar4 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)piVar17,uVar16,&modinfo_00->modulus,1);
    if (-1 < iVar4) goto LAB_00149600;
    local_120 = (ulong)((int)local_120 + 1);
    unaff_R12 = modinfo_00;
    local_124 = uVar16;
    goto LAB_00149138;
  }
LAB_001495d8:
  pcStack_130 = (code *)0x1495dd;
  secp256k1_modinv64_var_cold_20();
LAB_001495dd:
  pcStack_130 = (code *)0x1495e2;
  secp256k1_modinv64_var_cold_19();
LAB_001495e2:
  pcStack_130 = (code *)0x1495e7;
  secp256k1_modinv64_var_cold_18();
LAB_001495e7:
  pcStack_130 = (code *)0x1495ec;
  secp256k1_modinv64_var_cold_17();
LAB_001495ec:
  pcStack_130 = (code *)0x1495f1;
  secp256k1_modinv64_var_cold_14();
LAB_001495f1:
  pcStack_130 = (code *)0x1495f6;
  secp256k1_modinv64_var_cold_13();
LAB_001495f6:
  pcStack_130 = (code *)0x1495fb;
  secp256k1_modinv64_var_cold_12();
LAB_001495fb:
  pcStack_130 = (code *)0x149600;
  secp256k1_modinv64_var_cold_11();
LAB_00149600:
  pcStack_130 = (code *)0x149605;
  secp256k1_modinv64_var_cold_10();
LAB_00149605:
  pcStack_130 = (code *)0x14960a;
  secp256k1_modinv64_var_cold_15();
LAB_0014960a:
  pcStack_130 = (code *)0x14960f;
  secp256k1_modinv64_var_cold_16();
  unaff_R12 = modinfo_00;
LAB_0014960f:
  pcStack_130 = secp256k1_scalar_from_signed62;
  secp256k1_modinv64_var_cold_9();
  uVar25 = *piVar24;
  if (uVar25 >> 0x3e == 0) {
    uVar8 = piVar24[1];
    if (0x3fffffffffffffff < uVar8) goto LAB_0014969e;
    psVar14 = (secp256k1_modinv64_signed62 *)piVar24[2];
    if ((secp256k1_modinv64_signed62 *)0x3fffffffffffffff < psVar14) goto LAB_001496a3;
    uVar9 = piVar24[3];
    if (0x3fffffffffffffff < uVar9) goto LAB_001496a8;
    piVar24 = (int64_t *)piVar24[4];
    if (piVar24 < (int64_t *)0x100) {
      *a_00 = uVar8 << 0x3e | uVar25;
      a_00[1] = (long)psVar14 << 0x3c | uVar8 >> 2;
      a_00[2] = uVar9 << 0x3a | (ulong)psVar14 >> 4;
      a_00[3] = (long)piVar24 << 0x38 | uVar9 >> 6;
      secp256k1_scalar_verify((secp256k1_scalar *)a_00);
      return;
    }
  }
  else {
    piStack_138 = (int64_t *)0x14969e;
    secp256k1_scalar_from_signed62_cold_5();
LAB_0014969e:
    piStack_138 = (int64_t *)0x1496a3;
    secp256k1_scalar_from_signed62_cold_4();
LAB_001496a3:
    piStack_138 = (int64_t *)0x1496a8;
    secp256k1_scalar_from_signed62_cold_3();
LAB_001496a8:
    piStack_138 = (int64_t *)0x1496ad;
    secp256k1_scalar_from_signed62_cold_2();
  }
  piStack_138 = (int64_t *)secp256k1_modinv64_update_de_62;
  secp256k1_scalar_from_signed62_cold_1();
  piStack_138 = unaff_RBP;
  lStack_140 = lVar39;
  piStack_148 = piVar23;
  piStack_150 = piVar17;
  psStack_158 = unaff_R12;
  piStack_160 = unaff_RBX;
  lVar39 = *a_00;
  lStack_180 = a_00[1];
  lStack_188 = a_00[2];
  lStack_190 = a_00[3];
  lStack_1a0 = a_00[4];
  lVar19 = *piVar24;
  piStack_168 = (int64_t *)piVar24[1];
  lVar18 = piVar24[2];
  uStack_1c8 = *extraout_RDX;
  piStack_1c0 = (int64_t *)extraout_RDX[1];
  uStack_1d8 = extraout_RDX[2];
  piStack_1d0 = (int64_t *)extraout_RDX[3];
  lStack_170 = piVar24[3];
  lStack_1a8 = piVar24[4];
  uVar25 = 5;
  psVar15 = (secp256k1_modinv64_signed62 *)0xfffffffffffffffe;
  psStack_1e0 = (secp256k1_modinv64_signed62 *)0x149748;
  piVar17 = a_00;
  iVar4 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)a_00,5,psVar14,-2);
  piVar23 = piVar24;
  if (iVar4 < 1) {
LAB_0014a1ed:
    psStack_1e0 = (secp256k1_modinv64_signed62 *)0x14a1f2;
    secp256k1_modinv64_update_de_62_cold_34();
LAB_0014a1f2:
    psStack_1e0 = (secp256k1_modinv64_signed62 *)0x14a1f7;
    secp256k1_modinv64_update_de_62_cold_33();
LAB_0014a1f7:
    psStack_1e0 = (secp256k1_modinv64_signed62 *)0x14a1fc;
    secp256k1_modinv64_update_de_62_cold_32();
LAB_0014a1fc:
    psStack_1e0 = (secp256k1_modinv64_signed62 *)0x14a201;
    secp256k1_modinv64_update_de_62_cold_31();
LAB_0014a201:
    psStack_1e0 = (secp256k1_modinv64_signed62 *)0x14a206;
    secp256k1_modinv64_update_de_62_cold_30();
    psVar40 = psVar14;
LAB_0014a206:
    psStack_1e0 = (secp256k1_modinv64_signed62 *)0x14a20b;
    secp256k1_modinv64_update_de_62_cold_29();
LAB_0014a20b:
    psStack_1e0 = (secp256k1_modinv64_signed62 *)0x14a210;
    secp256k1_modinv64_update_de_62_cold_1();
    psVar14 = psVar40;
LAB_0014a210:
    psStack_1e0 = (secp256k1_modinv64_signed62 *)0x14a215;
    secp256k1_modinv64_update_de_62_cold_2();
LAB_0014a215:
    psStack_1e0 = (secp256k1_modinv64_signed62 *)0x14a21a;
    secp256k1_modinv64_update_de_62_cold_19();
LAB_0014a21a:
    psStack_1e0 = (secp256k1_modinv64_signed62 *)0x14a21f;
    secp256k1_modinv64_update_de_62_cold_17();
LAB_0014a21f:
    psStack_1e0 = (secp256k1_modinv64_signed62 *)0x14a224;
    secp256k1_modinv64_update_de_62_cold_14();
LAB_0014a224:
    psStack_1e0 = (secp256k1_modinv64_signed62 *)0x14a229;
    secp256k1_modinv64_update_de_62_cold_13();
LAB_0014a229:
    piVar32 = piVar17;
    psStack_1e0 = (secp256k1_modinv64_signed62 *)0x14a22e;
    secp256k1_modinv64_update_de_62_cold_12();
LAB_0014a22e:
    psStack_1e0 = (secp256k1_modinv64_signed62 *)0x14a233;
    secp256k1_modinv64_update_de_62_cold_11();
LAB_0014a233:
    psStack_1e0 = (secp256k1_modinv64_signed62 *)0x14a238;
    secp256k1_modinv64_update_de_62_cold_10();
LAB_0014a238:
    psStack_1e0 = (secp256k1_modinv64_signed62 *)0x14a23d;
    secp256k1_modinv64_update_de_62_cold_9();
    piVar17 = piVar32;
LAB_0014a23d:
    psStack_1e0 = (secp256k1_modinv64_signed62 *)0x14a242;
    secp256k1_modinv64_update_de_62_cold_28();
  }
  else {
    psVar15 = (secp256k1_modinv64_signed62 *)0x1;
    uVar25 = 5;
    psStack_1e0 = (secp256k1_modinv64_signed62 *)0x14976a;
    piVar17 = a_00;
    piStack_198 = a_00;
    iVar4 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)a_00,5,psVar14,1);
    if (-1 < iVar4) goto LAB_0014a1f2;
    uVar25 = 5;
    psVar15 = (secp256k1_modinv64_signed62 *)0xfffffffffffffffe;
    psStack_1e0 = (secp256k1_modinv64_signed62 *)0x149789;
    piVar17 = piVar24;
    iVar4 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)piVar24,5,psVar14,-2);
    if (iVar4 < 1) goto LAB_0014a1f7;
    psVar15 = (secp256k1_modinv64_signed62 *)0x1;
    uVar25 = 5;
    psStack_1e0 = (secp256k1_modinv64_signed62 *)0x1497a6;
    piVar17 = piVar24;
    iVar4 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)piVar24,5,psVar14,1);
    if (-1 < iVar4) goto LAB_0014a1fc;
    piVar23 = (int64_t *)0x3fffffffffffffff;
    psStack_1e0 = (secp256k1_modinv64_signed62 *)0x1497cc;
    piStack_1b0 = piVar24;
    lStack_178 = lVar18;
    iVar6 = secp256k1_modinv64_abs(uStack_1c8);
    psStack_1e0 = (secp256k1_modinv64_signed62 *)0x1497d9;
    piVar17 = piStack_1c0;
    iVar7 = secp256k1_modinv64_abs((int64_t)piStack_1c0);
    psVar15 = (secp256k1_modinv64_signed62 *)(0x4000000000000000 - iVar7);
    if ((long)psVar15 < iVar6) goto LAB_0014a201;
    psStack_1e0 = (secp256k1_modinv64_signed62 *)0x1497f4;
    iVar6 = secp256k1_modinv64_abs(uStack_1d8);
    psStack_1e0 = (secp256k1_modinv64_signed62 *)0x149801;
    piVar17 = piStack_1d0;
    iVar7 = secp256k1_modinv64_abs((int64_t)piStack_1d0);
    psVar15 = (secp256k1_modinv64_signed62 *)(0x4000000000000000 - iVar7);
    psVar40 = psVar14;
    if ((long)psVar15 < iVar6) goto LAB_0014a206;
    uVar25 = uStack_1c8 * lVar39;
    psVar15 = SUB168(SEXT816((long)uStack_1c8) * SEXT816(lVar39),8);
    uVar8 = (long)piStack_1c0 * lVar19;
    piVar17 = SUB168(SEXT816((long)piStack_1c0) * SEXT816(lVar19),8);
    a_00 = (int64_t *)0x7fffffffffffffff;
    lVar18 = (0x7fffffffffffffff - (long)piVar17) - (long)psVar15;
    if ((SBORROW8(0x7fffffffffffffff - (long)piVar17,(long)psVar15) !=
        SBORROW8(lVar18,(ulong)(~uVar8 < uVar25))) != (long)(lVar18 - (ulong)(~uVar8 < uVar25)) < 0
        && -1 < (long)piVar17) goto LAB_0014a23d;
    piVar24 = (int64_t *)(uVar8 + uVar25);
    piVar17 = (int64_t *)((long)piVar17 + (long)psVar15 + (ulong)CARRY8(uVar8,uVar25));
    uVar9 = uStack_1d8 * lVar39;
    lVar18 = SUB168(SEXT816((long)uStack_1d8) * SEXT816(lVar39),8);
    uVar10 = (long)piStack_1d0 * lVar19;
    lVar19 = SUB168(SEXT816((long)piStack_1d0) * SEXT816(lVar19),8);
    uVar8 = (ulong)(-uVar10 - 1 < uVar9);
    lVar39 = (0x7fffffffffffffff - lVar19) - lVar18;
    bVar41 = (SBORROW8(0x7fffffffffffffff - lVar19,lVar18) != SBORROW8(lVar39,uVar8)) !=
             (long)(lVar39 - uVar8) < 0;
    psVar15 = (secp256k1_modinv64_signed62 *)
              CONCAT71((int7)(-uVar10 - 1 >> 8),bVar41 && -1 < lVar19);
    if (!bVar41 || -1 >= lVar19) {
      psVar40 = (secp256k1_modinv64_signed62 *)(lStack_1a0 >> 0x3f);
      psVar15 = (secp256k1_modinv64_signed62 *)(lStack_1a8 >> 0x3f);
      lVar26 = ((ulong)piStack_1c0 & (ulong)psVar15) + (uStack_1c8 & (ulong)psVar40);
      piVar29 = (int64_t *)(uVar10 + uVar9);
      lVar19 = lVar19 + lVar18 + (ulong)CARRY8(uVar10,uVar9);
      lVar39 = psVar14->v[0];
      uVar8 = psVar14[1].v[0];
      uVar25 = lVar26 - (uVar8 * (long)piVar24 + lVar26 & 0x3fffffffffffffff);
      piVar31 = (int64_t *)(uVar25 * lVar39);
      piVar32 = SUB168(SEXT816((long)uVar25) * SEXT816(lVar39),8);
      psStack_1b8 = psVar14;
      if (-1 < (long)piVar32) {
        uVar9 = (ulong)((undefined1 *)(-(long)piVar31 - 1U) < piVar24);
        lVar18 = (0x7fffffffffffffff - (long)piVar32) - (long)piVar17;
        if ((SBORROW8(0x7fffffffffffffff - (long)piVar32,(long)piVar17) != SBORROW8(lVar18,uVar9))
            == (long)(lVar18 - uVar9) < 0) goto LAB_0014992f;
LAB_00149af0:
        psStack_1e0 = (secp256k1_modinv64_signed62 *)0x149af5;
        secp256k1_modinv64_update_de_62_cold_26();
LAB_00149af5:
        lVar26 = (-0x8000000000000000 - lVar39) - (ulong)(uVar8 != 0);
        lVar18 = lVar19 - lVar26;
        if ((SBORROW8(lVar19,lVar26) !=
            SBORROW8(lVar18,(ulong)(piVar29 < (secp256k1_modinv64_signed62 *)-uVar8))) ==
            (long)(lVar18 - (ulong)(piVar29 < (secp256k1_modinv64_signed62 *)-uVar8)) < 0)
        goto LAB_0014997f;
LAB_00149b17:
        psStack_1e0 = (secp256k1_modinv64_signed62 *)0x149b1c;
        secp256k1_modinv64_update_de_62_cold_25();
        uVar9 = extraout_RAX;
        lVar19 = extraout_RDX_00;
LAB_00149b1c:
        psVar40 = (secp256k1_modinv64_signed62 *)
                  ((-0x8000000000000000 - lVar19) - (ulong)(uVar9 != 0));
        piVar17 = (int64_t *)
                  (((long)piVar24 - (long)psVar40) -
                  (ulong)(piVar29 < (secp256k1_modinv64_signed62 *)-uVar9));
        if ((SBORROW8((long)piVar24,(long)psVar40) !=
            SBORROW8((long)piVar24 - (long)psVar40,
                     (ulong)(piVar29 < (secp256k1_modinv64_signed62 *)-uVar9))) == (long)piVar17 < 0
           ) {
LAB_00149a02:
          uVar8 = uVar8 >> 0x3e | lVar39 << 2;
          bVar41 = CARRY8((ulong)piVar29,uVar9);
          piVar29 = (int64_t *)((long)piVar29 + uVar9);
          piVar24 = (int64_t *)((long)piVar24 + (ulong)bVar41 + lVar19);
          psVar40 = (secp256k1_modinv64_signed62 *)(uStack_1d8 * lStack_180 + uVar8);
          piVar17 = (int64_t *)
                    (SUB168(SEXT816((long)uStack_1d8) * SEXT816(lStack_180),8) + (lVar39 >> 0x3e) +
                    (ulong)CARRY8(uStack_1d8 * lStack_180,uVar8));
          uVar8 = (long)piStack_1d0 * (long)piVar32;
          lVar39 = SUB168(SEXT816((long)piStack_1d0) * SEXT816((long)piVar32),8);
          if (lVar39 < 0) goto LAB_00149b46;
          uVar9 = (ulong)((secp256k1_modinv64_signed62 *)(-1 - uVar8) < psVar40);
          lVar19 = (0x7fffffffffffffff - lVar39) - (long)piVar17;
          psVar14 = (secp256k1_modinv64_signed62 *)(lVar19 - uVar9);
          if ((SBORROW8(0x7fffffffffffffff - lVar39,(long)piVar17) != SBORROW8(lVar19,uVar9)) !=
              (long)psVar14 < 0) goto LAB_00149b5e;
        }
        else {
LAB_00149b41:
          psStack_1e0 = (secp256k1_modinv64_signed62 *)0x149b46;
          secp256k1_modinv64_update_de_62_cold_24();
          uVar8 = extraout_RAX_00;
          lVar39 = extraout_RDX_01;
LAB_00149b46:
          psVar14 = (secp256k1_modinv64_signed62 *)
                    ((-0x8000000000000000 - lVar39) - (ulong)(uVar8 != 0));
          if ((SBORROW8((long)piVar17,(long)psVar14) !=
              SBORROW8((long)piVar17 - (long)psVar14,
                       (ulong)(psVar40 < (secp256k1_modinv64_signed62 *)-uVar8))) !=
              (long)(((long)piVar17 - (long)psVar14) -
                    (ulong)(psVar40 < (secp256k1_modinv64_signed62 *)-uVar8)) < 0) {
LAB_00149b5e:
            psStack_1e0 = (secp256k1_modinv64_signed62 *)0x149b63;
            secp256k1_modinv64_update_de_62_cold_23();
            goto LAB_00149b69;
          }
        }
        bVar41 = CARRY8((ulong)psVar40,uVar8);
        psVar40 = (secp256k1_modinv64_signed62 *)((long)psVar40->v + uVar8);
        piVar17 = (int64_t *)((long)piVar17 + (ulong)bVar41 + lVar39);
        psVar33 = (secp256k1_modinv64_signed62 *)psStack_1b8->v[1];
        psVar14 = psStack_1b8;
        if (psVar33 == (secp256k1_modinv64_signed62 *)0x0) goto LAB_00149b69;
        piVar31 = (int64_t *)((long)psVar33 * uVar25);
        piVar20 = SUB168(SEXT816((long)psVar33) * SEXT816((long)uVar25),8);
        if ((long)piVar20 < 0) goto LAB_0014a103;
        uVar8 = (ulong)((secp256k1_modinv64_signed62 *)(-(long)piVar31 - 1U) < piVar29);
        lVar39 = (0x7fffffffffffffff - (long)piVar20) - (long)piVar24;
        if ((SBORROW8(0x7fffffffffffffff - (long)piVar20,(long)piVar24) != SBORROW8(lVar39,uVar8))
            != (long)(lVar39 - uVar8) < 0) goto LAB_0014a125;
LAB_00149a9c:
        bVar41 = CARRY8((ulong)piVar31,(ulong)piVar29);
        piVar31 = (int64_t *)((long)piVar31 + (long)piVar29);
        piVar20 = (int64_t *)((long)piVar20 + (long)piVar24 + (ulong)bVar41);
        uVar8 = (long)psVar33 * (long)psVar15;
        lVar39 = SUB168(SEXT816((long)psVar33) * SEXT816((long)psVar15),8);
        if (lVar39 < 0) goto LAB_0014a12a;
        psVar28 = (secp256k1_modinv64_signed62 *)(-1 - uVar8);
        lVar19 = ((long)a_00 - lVar39) - (long)piVar17;
        puVar30 = (undefined1 *)(lVar19 - (ulong)(psVar28 < psVar40));
        if ((SBORROW8((long)a_00 - lVar39,(long)piVar17) !=
            SBORROW8(lVar19,(ulong)(psVar28 < psVar40))) != (long)puVar30 < 0) goto LAB_0014a14c;
LAB_00149acd:
        bVar41 = CARRY8((ulong)psVar40,uVar8);
        psVar40 = (secp256k1_modinv64_signed62 *)((long)psVar40->v + uVar8);
        piVar17 = (int64_t *)((long)piVar17 + (ulong)bVar41 + lVar39);
        piVar24 = piVar20;
        piVar29 = piVar31;
LAB_00149b69:
        piVar20 = piStack_198;
        uVar8 = (long)piVar24 << 2 | (ulong)piVar29 >> 0x3e;
        piVar32 = (int64_t *)(uStack_1c8 * lStack_188 + uVar8);
        psVar33 = (secp256k1_modinv64_signed62 *)
                  (SUB168(SEXT816((long)uStack_1c8) * SEXT816(lStack_188),8) +
                   ((long)piVar24 >> 0x3e) + (ulong)CARRY8(uStack_1c8 * lStack_188,uVar8));
        *piStack_198 = (ulong)piVar29 & 0x3fffffffffffffff;
        uVar8 = (long)piStack_1c0 * lStack_178;
        lVar39 = SUB168(SEXT816((long)piStack_1c0) * SEXT816(lStack_178),8);
        *piStack_1b0 = (ulong)psVar40 & 0x3fffffffffffffff;
        if (lVar39 < 0) {
          puVar30 = (undefined1 *)((-0x8000000000000000 - lVar39) - (ulong)(uVar8 != 0));
          psVar28 = (secp256k1_modinv64_signed62 *)
                    (((long)psVar33 - (long)puVar30) -
                    (ulong)(piVar32 < (secp256k1_modinv64_signed62 *)-uVar8));
          if ((SBORROW8((long)psVar33,(long)puVar30) !=
              SBORROW8((long)psVar33 - (long)puVar30,
                       (ulong)(piVar32 < (secp256k1_modinv64_signed62 *)-uVar8))) !=
              (long)psVar28 < 0) goto LAB_00149cc7;
LAB_00149bd7:
          uVar9 = (ulong)psVar40 >> 0x3e | (long)piVar17 << 2;
          bVar41 = CARRY8((ulong)piVar32,uVar8);
          piVar32 = (int64_t *)((long)piVar32 + uVar8);
          psVar33 = (secp256k1_modinv64_signed62 *)((long)psVar33->v + (ulong)bVar41 + lVar39);
          puVar30 = (undefined1 *)(uStack_1d8 * lStack_188 + uVar9);
          psVar28 = (secp256k1_modinv64_signed62 *)
                    (SUB168(SEXT816((long)uStack_1d8) * SEXT816(lStack_188),8) +
                     ((long)piVar17 >> 0x3e) + (ulong)CARRY8(uStack_1d8 * lStack_188,uVar9));
          uVar8 = (long)piStack_1d0 * lStack_178;
          lVar39 = SUB168(SEXT816((long)piStack_1d0) * SEXT816(lStack_178),8);
          if (lVar39 < 0) goto LAB_00149ccc;
          uVar9 = (ulong)((undefined1 *)(-1 - uVar8) < puVar30);
          lVar19 = ((long)a_00 - lVar39) - (long)psVar28;
          if ((SBORROW8((long)a_00 - lVar39,(long)psVar28) != SBORROW8(lVar19,uVar9)) !=
              (long)(lVar19 - uVar9) < 0) goto LAB_00149cee;
        }
        else {
          psVar28 = (secp256k1_modinv64_signed62 *)(-1 - uVar8);
          lVar19 = ((long)a_00 - lVar39) - (long)psVar33;
          puVar30 = (undefined1 *)(lVar19 - (ulong)(psVar28 < piVar32));
          if ((SBORROW8((long)a_00 - lVar39,(long)psVar33) !=
              SBORROW8(lVar19,(ulong)(psVar28 < piVar32))) == (long)puVar30 < 0) goto LAB_00149bd7;
LAB_00149cc7:
          psStack_1e0 = (secp256k1_modinv64_signed62 *)0x149ccc;
          secp256k1_modinv64_update_de_62_cold_22();
          uVar8 = extraout_RAX_01;
          lVar39 = extraout_RDX_02;
LAB_00149ccc:
          lVar18 = (-0x8000000000000000 - lVar39) - (ulong)(uVar8 != 0);
          lVar19 = (long)psVar28 - lVar18;
          if ((SBORROW8((long)psVar28,lVar18) !=
              SBORROW8(lVar19,(ulong)(puVar30 < (undefined1 *)-uVar8))) !=
              (long)(lVar19 - (ulong)(puVar30 < (undefined1 *)-uVar8)) < 0) {
LAB_00149cee:
            psStack_1e0 = (secp256k1_modinv64_signed62 *)0x149cf3;
            secp256k1_modinv64_update_de_62_cold_21();
            goto LAB_00149cf9;
          }
        }
        bVar41 = CARRY8((ulong)puVar30,uVar8);
        puVar30 = puVar30 + uVar8;
        psVar28 = (secp256k1_modinv64_signed62 *)((long)psVar28->v + (ulong)bVar41 + lVar39);
        piVar31 = (int64_t *)psVar14->v[2];
        if (piVar31 == (int64_t *)0x0) goto LAB_00149cf9;
        piVar17 = (int64_t *)((long)piVar31 * uVar25);
        psVar40 = SUB168(SEXT816((long)piVar31) * SEXT816((long)uVar25),8);
        if ((long)psVar40 < 0) goto LAB_0014a151;
        uVar8 = (ulong)((secp256k1_modinv64_signed62 *)(-(long)piVar17 - 1U) < piVar32);
        lVar39 = ((long)a_00 - (long)psVar40) - (long)psVar33;
        piVar24 = piVar32;
        if ((SBORROW8((long)a_00 - (long)psVar40,(long)psVar33) != SBORROW8(lVar39,uVar8)) !=
            (long)(lVar39 - uVar8) < 0) goto LAB_0014a173;
LAB_00149c6c:
        bVar41 = CARRY8((ulong)piVar17,(ulong)piVar24);
        piVar17 = (int64_t *)((long)piVar17 + (long)piVar24);
        psVar40 = (secp256k1_modinv64_signed62 *)
                  ((long)psVar33->v + (ulong)bVar41 + (long)psVar40->v);
        uVar8 = (long)piVar31 * (long)psVar15;
        lVar39 = SUB168(SEXT816((long)piVar31) * SEXT816((long)psVar15),8);
        if (lVar39 < 0) goto LAB_0014a178;
        piVar34 = (int64_t *)(-1 - uVar8);
        lVar19 = ((long)a_00 - lVar39) - (long)psVar28;
        psVar14 = (secp256k1_modinv64_signed62 *)(lVar19 - (ulong)(piVar34 < puVar30));
        piVar32 = piVar17;
        psVar33 = psVar40;
        if ((SBORROW8((long)a_00 - lVar39,(long)psVar28) !=
            SBORROW8(lVar19,(ulong)(piVar34 < puVar30))) != (long)psVar14 < 0) goto LAB_0014a19a;
LAB_00149c9d:
        bVar41 = CARRY8((ulong)puVar30,uVar8);
        puVar30 = puVar30 + uVar8;
        psVar28 = (secp256k1_modinv64_signed62 *)((long)psVar28->v + (ulong)bVar41 + lVar39);
LAB_00149cf9:
        uVar8 = (long)psVar33 << 2 | (ulong)piVar32 >> 0x3e;
        piVar24 = (int64_t *)(uStack_1c8 * lStack_190 + uVar8);
        piVar34 = (int64_t *)
                  (SUB168(SEXT816((long)uStack_1c8) * SEXT816(lStack_190),8) +
                   ((long)psVar33 >> 0x3e) + (ulong)CARRY8(uStack_1c8 * lStack_190,uVar8));
        piVar20[1] = (ulong)piVar32 & 0x3fffffffffffffff;
        uVar8 = (long)piStack_1c0 * lStack_170;
        lVar39 = SUB168(SEXT816((long)piStack_1c0) * SEXT816(lStack_170),8);
        piStack_1b0[1] = (ulong)puVar30 & 0x3fffffffffffffff;
        if (lVar39 < 0) {
          uVar9 = (-0x8000000000000000 - lVar39) - (ulong)(uVar8 != 0);
          piVar17 = (int64_t *)
                    (((long)piVar34 - uVar9) -
                    (ulong)(piVar24 < (secp256k1_modinv64_signed62 *)-uVar8));
          if ((SBORROW8((long)piVar34,uVar9) !=
              SBORROW8((long)piVar34 - uVar9,
                       (ulong)(piVar24 < (secp256k1_modinv64_signed62 *)-uVar8))) !=
              (long)piVar17 < 0) goto LAB_00149dcf;
LAB_00149d65:
          uVar10 = (ulong)puVar30 >> 0x3e | (long)psVar28 << 2;
          bVar41 = CARRY8((ulong)piVar24,uVar8);
          piVar24 = (int64_t *)((long)piVar24 + uVar8);
          piVar34 = (int64_t *)((long)piVar34 + (ulong)bVar41 + lVar39);
          uVar9 = uStack_1d8 * lStack_190 + uVar10;
          piVar17 = (int64_t *)
                    (SUB168(SEXT816((long)uStack_1d8) * SEXT816(lStack_190),8) +
                     ((long)psVar28 >> 0x3e) + (ulong)CARRY8(uStack_1d8 * lStack_190,uVar10));
          uVar8 = (long)piStack_1d0 * lStack_170;
          lVar39 = SUB168(SEXT816((long)piStack_1d0) * SEXT816(lStack_170),8);
          if (lVar39 < 0) goto LAB_00149dd4;
          uVar10 = (ulong)(-uVar8 - 1 < uVar9);
          lVar19 = ((long)a_00 - lVar39) - (long)piVar17;
          bVar41 = SBORROW8((long)a_00 - lVar39,(long)piVar17) != SBORROW8(lVar19,uVar10);
          lVar19 = lVar19 - uVar10;
        }
        else {
          piVar17 = (int64_t *)(-1 - uVar8);
          lVar19 = ((long)a_00 - lVar39) - (long)piVar34;
          uVar9 = lVar19 - (ulong)(piVar17 < piVar24);
          if ((SBORROW8((long)a_00 - lVar39,(long)piVar34) !=
              SBORROW8(lVar19,(ulong)(piVar17 < piVar24))) == (long)uVar9 < 0) goto LAB_00149d65;
LAB_00149dcf:
          psStack_1e0 = (secp256k1_modinv64_signed62 *)0x149dd4;
          secp256k1_modinv64_update_de_62_cold_20();
          uVar8 = extraout_RAX_02;
          lVar39 = extraout_RDX_03;
LAB_00149dd4:
          lVar18 = (-0x8000000000000000 - lVar39) - (ulong)(uVar8 != 0);
          lVar19 = (long)piVar17 - lVar18;
          bVar41 = SBORROW8((long)piVar17,lVar18) != SBORROW8(lVar19,(ulong)(uVar9 < -uVar8));
          lVar19 = lVar19 - (ulong)(uVar9 < -uVar8);
        }
        psVar14 = (secp256k1_modinv64_signed62 *)0x8000000000000000;
        if (bVar41 != lVar19 < 0) goto LAB_0014a215;
        psVar40 = (secp256k1_modinv64_signed62 *)(uVar9 + uVar8);
        piVar17 = (int64_t *)((long)piVar17 + (ulong)CARRY8(uVar9,uVar8) + lVar39);
        psVar28 = (secp256k1_modinv64_signed62 *)psStack_1b8->v[3];
        if (psVar28 == (secp256k1_modinv64_signed62 *)0x0) goto LAB_00149e73;
        piVar31 = (int64_t *)((long)psVar28 * uVar25);
        piVar20 = SUB168(SEXT816((long)psVar28) * SEXT816((long)uVar25),8);
        if ((long)piVar20 < 0) goto LAB_0014a19f;
        uVar8 = (ulong)((secp256k1_modinv64_signed62 *)(-(long)piVar31 - 1U) < piVar24);
        lVar39 = ((long)a_00 - (long)piVar20) - (long)piVar34;
        if ((SBORROW8((long)a_00 - (long)piVar20,(long)piVar34) != SBORROW8(lVar39,uVar8)) !=
            (long)(lVar39 - uVar8) < 0) goto LAB_0014a1c1;
LAB_00149e34:
        bVar41 = CARRY8((ulong)piVar31,(ulong)piVar24);
        piVar31 = (int64_t *)((long)piVar31 + (long)piVar24);
        piVar20 = (int64_t *)((long)piVar20 + (long)piVar34 + (ulong)bVar41);
        uVar8 = (long)psVar28 * (long)psVar15;
        lVar39 = SUB168(SEXT816((long)psVar28) * SEXT816((long)psVar15),8);
        if (lVar39 < 0) goto LAB_0014a1c6;
        uVar9 = (ulong)((secp256k1_modinv64_signed62 *)(-1 - uVar8) < psVar40);
        lVar19 = ((long)a_00 - lVar39) - (long)piVar17;
        piVar34 = piVar20;
        piVar24 = piVar31;
        if ((SBORROW8((long)a_00 - lVar39,(long)piVar17) != SBORROW8(lVar19,uVar9)) ==
            (long)(lVar19 - uVar9) < 0) {
          do {
            bVar41 = CARRY8((ulong)psVar40,uVar8);
            psVar40 = (secp256k1_modinv64_signed62 *)((long)psVar40->v + uVar8);
            piVar17 = (int64_t *)((long)piVar17 + (ulong)bVar41 + lVar39);
LAB_00149e73:
            piVar32 = piStack_198;
            uVar8 = (long)piVar34 << 2 | (ulong)piVar24 >> 0x3e;
            psVar33 = (secp256k1_modinv64_signed62 *)((ulong)piVar24 & 0x3fffffffffffffff);
            piVar29 = (int64_t *)(uStack_1c8 * lStack_1a0 + uVar8);
            piVar24 = (int64_t *)
                      (SUB168(SEXT816((long)uStack_1c8) * SEXT816(lStack_1a0),8) +
                       ((long)piVar34 >> 0x3e) + (ulong)CARRY8(uStack_1c8 * lStack_1a0,uVar8));
            piStack_198[2] = (int64_t)psVar33;
            uVar8 = (long)piStack_1c0 * lStack_1a8;
            lVar39 = SUB168(SEXT816((long)piStack_1c0) * SEXT816(lStack_1a8),8);
            piStack_1b0[2] = (ulong)psVar40 & 0x3fffffffffffffff;
            if (lVar39 < 0) {
              lVar18 = (-0x8000000000000000 - lVar39) - (ulong)(uVar8 != 0);
              lVar19 = (long)piVar24 - lVar18;
              psVar28 = (secp256k1_modinv64_signed62 *)
                        (lVar19 - (ulong)(piVar29 < (secp256k1_modinv64_signed62 *)-uVar8));
              if ((SBORROW8((long)piVar24,lVar18) !=
                  SBORROW8(lVar19,(ulong)(piVar29 < (secp256k1_modinv64_signed62 *)-uVar8))) !=
                  (long)psVar28 < 0) goto LAB_00149f4d;
LAB_00149ee1:
              uVar9 = (ulong)psVar40 >> 0x3e | (long)piVar17 << 2;
              bVar41 = CARRY8((ulong)piVar29,uVar8);
              piVar29 = (int64_t *)((long)piVar29 + uVar8);
              piVar24 = (int64_t *)((long)piVar24 + (ulong)bVar41 + lVar39);
              psVar33 = (secp256k1_modinv64_signed62 *)(uStack_1d8 * lStack_1a0 + uVar9);
              psVar28 = (secp256k1_modinv64_signed62 *)
                        (SUB168(SEXT816((long)uStack_1d8) * SEXT816(lStack_1a0),8) +
                         ((long)piVar17 >> 0x3e) + (ulong)CARRY8(uStack_1d8 * lStack_1a0,uVar9));
              uVar8 = (long)piStack_1d0 * lStack_1a8;
              lVar39 = SUB168(SEXT816((long)piStack_1d0) * SEXT816(lStack_1a8),8);
              if (lVar39 < 0) goto LAB_00149f52;
              piVar17 = (int64_t *)(-1 - uVar8);
              lVar19 = ((long)a_00 - lVar39) - (long)psVar28;
              bVar41 = SBORROW8((long)a_00 - lVar39,(long)psVar28) !=
                       SBORROW8(lVar19,(ulong)(piVar17 < psVar33));
              piVar31 = (int64_t *)(lVar19 - (ulong)(piVar17 < psVar33));
            }
            else {
              psVar28 = (secp256k1_modinv64_signed62 *)(-1 - uVar8);
              lVar19 = ((long)a_00 - lVar39) - (long)piVar24;
              if ((SBORROW8((long)a_00 - lVar39,(long)piVar24) !=
                  SBORROW8(lVar19,(ulong)(psVar28 < piVar29))) ==
                  (long)(lVar19 - (ulong)(psVar28 < piVar29)) < 0) goto LAB_00149ee1;
LAB_00149f4d:
              psStack_1e0 = (secp256k1_modinv64_signed62 *)0x149f52;
              secp256k1_modinv64_update_de_62_cold_18();
              uVar8 = extraout_RAX_03;
              lVar39 = extraout_RDX_04;
LAB_00149f52:
              lVar18 = (-0x8000000000000000 - lVar39) - (ulong)(uVar8 != 0);
              lVar19 = (long)psVar28 - lVar18;
              bVar41 = SBORROW8((long)psVar28,lVar18) !=
                       SBORROW8(lVar19,(ulong)(psVar33 < (secp256k1_modinv64_signed62 *)-uVar8));
              piVar17 = (int64_t *)
                        (lVar19 - (ulong)(psVar33 < (secp256k1_modinv64_signed62 *)-uVar8));
              piVar31 = piVar17;
            }
            psVar14 = psStack_1b8;
            piVar20 = (int64_t *)0x8000000000000000;
            if (bVar41 != (long)piVar31 < 0) goto LAB_0014a21a;
            piVar31 = (int64_t *)((long)psVar33->v + uVar8);
            psVar33 = (secp256k1_modinv64_signed62 *)
                      ((long)psVar28->v + (ulong)CARRY8((ulong)psVar33,uVar8) + lVar39);
            psVar40 = (secp256k1_modinv64_signed62 *)psStack_1b8->v[4];
            piVar17 = (int64_t *)((long)psVar40 * uVar25);
            uVar25 = SUB168(SEXT816((long)psVar40) * SEXT816((long)uVar25),8);
            if ((long)uVar25 < 0) {
              lVar19 = (-0x8000000000000000 - uVar25) - (ulong)(piVar17 != (int64_t *)0x0);
              lVar39 = (long)piVar24 - lVar19;
              if ((SBORROW8((long)piVar24,lVar19) !=
                  SBORROW8(lVar39,(ulong)(piVar29 < (secp256k1_modinv64_signed62 *)-(long)piVar17)))
                  != (long)(lVar39 - (ulong)(piVar29 < (secp256k1_modinv64_signed62 *)-(long)piVar17
                                            )) < 0) goto LAB_0014a0de;
LAB_00149fad:
              bVar41 = CARRY8((ulong)piVar17,(ulong)piVar29);
              piVar17 = (int64_t *)((long)piVar17 + (long)piVar29);
              uVar25 = (long)piVar24 + bVar41 + uVar25;
              uVar8 = (long)psVar40 * (long)psVar15;
              lVar39 = SUB168(SEXT816((long)psVar40) * SEXT816((long)psVar15),8);
              if (lVar39 < 0) goto LAB_0014a0e3;
              psVar15 = (secp256k1_modinv64_signed62 *)(-uVar8 - 1);
              lVar19 = (long)a_00 - lVar39;
              lVar18 = lVar19 - (long)psVar33;
              a_00 = (int64_t *)(lVar18 - (ulong)(psVar15 < piVar31));
              if ((SBORROW8(lVar19,(long)psVar33) != SBORROW8(lVar18,(ulong)(psVar15 < piVar31))) ==
                  (long)a_00 < 0) goto LAB_00149fdb;
            }
            else {
              uVar8 = (ulong)((secp256k1_modinv64_signed62 *)(-(long)piVar17 - 1U) < piVar29);
              lVar39 = ((long)a_00 - uVar25) - (long)piVar24;
              if ((SBORROW8((long)a_00 - uVar25,(long)piVar24) != SBORROW8(lVar39,uVar8)) ==
                  (long)(lVar39 - uVar8) < 0) goto LAB_00149fad;
LAB_0014a0de:
              psStack_1e0 = (secp256k1_modinv64_signed62 *)0x14a0e3;
              secp256k1_modinv64_update_de_62_cold_16();
              uVar8 = extraout_RAX_04;
              lVar39 = extraout_RDX_05;
LAB_0014a0e3:
              piVar24 = (int64_t *)((-0x8000000000000000 - lVar39) - (ulong)(uVar8 != 0));
              psVar15 = (secp256k1_modinv64_signed62 *)
                        (((long)psVar33 - (long)piVar24) -
                        (ulong)(piVar31 < (secp256k1_modinv64_signed62 *)-uVar8));
              if ((SBORROW8((long)psVar33,(long)piVar24) !=
                  SBORROW8((long)psVar33 - (long)piVar24,
                           (ulong)(piVar31 < (secp256k1_modinv64_signed62 *)-uVar8))) ==
                  (long)psVar15 < 0) {
LAB_00149fdb:
                a_00 = piStack_1b0;
                lVar39 = (long)psVar33->v + (ulong)CARRY8(uVar8,(ulong)piVar31) + lVar39;
                psVar15 = (secp256k1_modinv64_signed62 *)(uVar25 << 2 | (ulong)piVar17 >> 0x3e);
                piVar32[3] = (ulong)piVar17 & 0x3fffffffffffffff;
                piVar23 = (int64_t *)(uVar8 + (long)piVar31 & 0x3fffffffffffffff);
                piStack_1b0[3] = (int64_t)piVar23;
                piVar17 = psVar15[0x333333333333332].v + 4;
                uVar25 = ((long)uVar25 >> 0x3e) + -1 +
                         (ulong)((secp256k1_modinv64_signed62 *)0x7fffffffffffffff < psVar15);
                if (uVar25 != 0xffffffffffffffff) goto LAB_0014a21f;
                uVar25 = 0xffffffffffffffff;
                uVar8 = uVar8 + (long)piVar31 >> 0x3e | lVar39 * 4;
                piVar32[4] = (int64_t)psVar15;
                if ((lVar39 >> 0x3e) + -1 + (ulong)(0x7fffffffffffffff < uVar8) != -1)
                goto LAB_0014a224;
                piStack_1b0[4] = uVar8;
                uVar25 = 5;
                psVar15 = (secp256k1_modinv64_signed62 *)0xfffffffffffffffe;
                psStack_1e0 = (secp256k1_modinv64_signed62 *)0x14a053;
                piVar17 = piVar32;
                iVar4 = secp256k1_modinv64_mul_cmp_62
                                  ((secp256k1_modinv64_signed62 *)piVar32,5,psVar14,-2);
                if (iVar4 < 1) goto LAB_0014a229;
                psVar15 = (secp256k1_modinv64_signed62 *)0x1;
                uVar25 = 5;
                psStack_1e0 = (secp256k1_modinv64_signed62 *)0x14a070;
                iVar4 = secp256k1_modinv64_mul_cmp_62
                                  ((secp256k1_modinv64_signed62 *)piVar32,5,psVar14,1);
                if (-1 < iVar4) goto LAB_0014a22e;
                uVar25 = 5;
                psVar15 = (secp256k1_modinv64_signed62 *)0xfffffffffffffffe;
                psStack_1e0 = (secp256k1_modinv64_signed62 *)0x14a08f;
                piVar32 = a_00;
                iVar4 = secp256k1_modinv64_mul_cmp_62
                                  ((secp256k1_modinv64_signed62 *)a_00,5,psVar14,-2);
                if (iVar4 < 1) goto LAB_0014a233;
                psVar15 = (secp256k1_modinv64_signed62 *)0x1;
                uVar25 = 5;
                psStack_1e0 = (secp256k1_modinv64_signed62 *)0x14a0ac;
                piVar32 = a_00;
                iVar4 = secp256k1_modinv64_mul_cmp_62
                                  ((secp256k1_modinv64_signed62 *)a_00,5,psVar14,1);
                if (iVar4 < 0) {
                  return;
                }
                goto LAB_0014a238;
              }
            }
            psStack_1e0 = (secp256k1_modinv64_signed62 *)0x14a103;
            secp256k1_modinv64_update_de_62_cold_15();
LAB_0014a103:
            lVar19 = (-0x8000000000000000 - (long)piVar20) - (ulong)(piVar31 != (int64_t *)0x0);
            lVar39 = (long)piVar24 - lVar19;
            if ((SBORROW8((long)piVar24,lVar19) !=
                SBORROW8(lVar39,(ulong)(piVar29 < (secp256k1_modinv64_signed62 *)-(long)piVar31)))
                == (long)(lVar39 - (ulong)(piVar29 < (secp256k1_modinv64_signed62 *)-(long)piVar31))
                   < 0) goto LAB_00149a9c;
LAB_0014a125:
            psStack_1e0 = (secp256k1_modinv64_signed62 *)0x14a12a;
            secp256k1_modinv64_update_de_62_cold_4();
            uVar8 = extraout_RAX_05;
            lVar39 = extraout_RDX_06;
LAB_0014a12a:
            puVar30 = (undefined1 *)((-0x8000000000000000 - lVar39) - (ulong)(uVar8 != 0));
            psVar28 = (secp256k1_modinv64_signed62 *)
                      (((long)piVar17 - (long)puVar30) -
                      (ulong)(psVar40 < (secp256k1_modinv64_signed62 *)-uVar8));
            if ((SBORROW8((long)piVar17,(long)puVar30) !=
                SBORROW8((long)piVar17 - (long)puVar30,
                         (ulong)(psVar40 < (secp256k1_modinv64_signed62 *)-uVar8))) ==
                (long)psVar28 < 0) goto LAB_00149acd;
LAB_0014a14c:
            psStack_1e0 = (secp256k1_modinv64_signed62 *)0x14a151;
            secp256k1_modinv64_update_de_62_cold_3();
LAB_0014a151:
            lVar19 = (-0x8000000000000000 - (long)psVar40) - (ulong)(piVar17 != (int64_t *)0x0);
            lVar39 = (long)psVar33 - lVar19;
            piVar24 = piVar32;
            if ((SBORROW8((long)psVar33,lVar19) !=
                SBORROW8(lVar39,(ulong)(piVar32 < (secp256k1_modinv64_signed62 *)-(long)piVar17)))
                == (long)(lVar39 - (ulong)(piVar32 < (secp256k1_modinv64_signed62 *)-(long)piVar17))
                   < 0) goto LAB_00149c6c;
LAB_0014a173:
            psStack_1e0 = (secp256k1_modinv64_signed62 *)0x14a178;
            secp256k1_modinv64_update_de_62_cold_6();
            uVar8 = extraout_RAX_06;
            lVar39 = extraout_RDX_07;
            piVar24 = piVar32;
LAB_0014a178:
            psVar14 = (secp256k1_modinv64_signed62 *)
                      ((-0x8000000000000000 - lVar39) - (ulong)(uVar8 != 0));
            piVar34 = (int64_t *)
                      (((long)psVar28 - (long)psVar14) - (ulong)(puVar30 < (undefined1 *)-uVar8));
            piVar32 = piVar17;
            psVar33 = psVar40;
            if ((SBORROW8((long)psVar28,(long)psVar14) !=
                SBORROW8((long)psVar28 - (long)psVar14,(ulong)(puVar30 < (undefined1 *)-uVar8))) ==
                (long)piVar34 < 0) goto LAB_00149c9d;
LAB_0014a19a:
            psStack_1e0 = (secp256k1_modinv64_signed62 *)0x14a19f;
            secp256k1_modinv64_update_de_62_cold_5();
LAB_0014a19f:
            lVar19 = (-0x8000000000000000 - (long)piVar20) - (ulong)(piVar31 != (int64_t *)0x0);
            lVar39 = (long)piVar34 - lVar19;
            if ((SBORROW8((long)piVar34,lVar19) !=
                SBORROW8(lVar39,(ulong)(piVar24 < (secp256k1_modinv64_signed62 *)-(long)piVar31)))
                == (long)(lVar39 - (ulong)(piVar24 < (secp256k1_modinv64_signed62 *)-(long)piVar31))
                   < 0) goto LAB_00149e34;
LAB_0014a1c1:
            psStack_1e0 = (secp256k1_modinv64_signed62 *)0x14a1c6;
            secp256k1_modinv64_update_de_62_cold_8();
            uVar8 = extraout_RAX_07;
            lVar39 = extraout_RDX_08;
LAB_0014a1c6:
            lVar18 = (-0x8000000000000000 - lVar39) - (ulong)(uVar8 != 0);
            lVar19 = (long)piVar17 - lVar18;
            piVar34 = piVar20;
            piVar24 = piVar31;
            if ((SBORROW8((long)piVar17,lVar18) !=
                SBORROW8(lVar19,(ulong)(psVar40 < (secp256k1_modinv64_signed62 *)-uVar8))) !=
                (long)(lVar19 - (ulong)(psVar40 < (secp256k1_modinv64_signed62 *)-uVar8)) < 0)
            break;
          } while( true );
        }
        psStack_1e0 = (secp256k1_modinv64_signed62 *)0x14a1ed;
        secp256k1_modinv64_update_de_62_cold_7();
        goto LAB_0014a1ed;
      }
      lVar26 = (-0x8000000000000000 - (long)piVar32) - (ulong)(piVar31 != (int64_t *)0x0);
      lVar18 = (long)piVar17 - lVar26;
      if ((SBORROW8((long)piVar17,lVar26) !=
          SBORROW8(lVar18,(ulong)(piVar24 < (undefined1 *)-(long)piVar31))) !=
          (long)(lVar18 - (ulong)(piVar24 < (undefined1 *)-(long)piVar31)) < 0) goto LAB_00149af0;
LAB_0014992f:
      psVar40 = (secp256k1_modinv64_signed62 *)((ulong)psVar40 & uStack_1d8);
      psVar15 = (secp256k1_modinv64_signed62 *)
                ((long)psVar40 +
                (((ulong)psVar15 & (ulong)piStack_1d0) -
                ((long)psVar40->v + uVar8 * (long)piVar29 + ((ulong)psVar15 & (ulong)piStack_1d0) &
                0x3fffffffffffffff)));
      bVar41 = CARRY8((ulong)piVar31,(ulong)piVar24);
      piVar31 = (int64_t *)((long)piVar31 + (long)piVar24);
      piVar32 = (int64_t *)((long)piVar32 + (long)piVar17 + (ulong)bVar41);
      uVar8 = (long)psVar15 * lVar39;
      lVar39 = SUB168(SEXT816((long)psVar15) * SEXT816(lVar39),8);
      if (lVar39 < 0) goto LAB_00149af5;
      uVar9 = (ulong)((secp256k1_modinv64_signed62 *)(-uVar8 - 1) < piVar29);
      lVar18 = (0x7fffffffffffffff - lVar39) - lVar19;
      if ((SBORROW8(0x7fffffffffffffff - lVar39,lVar19) != SBORROW8(lVar18,uVar9)) !=
          (long)(lVar18 - uVar9) < 0) goto LAB_00149b17;
LAB_0014997f:
      bVar41 = CARRY8(uVar8,(ulong)piVar29);
      uVar8 = uVar8 + (long)piVar29;
      lVar39 = lVar39 + lVar19 + (ulong)bVar41;
      if (((ulong)piVar31 & 0x3fffffffffffffff) != 0) goto LAB_0014a20b;
      psVar14 = psVar40;
      if ((uVar8 & 0x3fffffffffffffff) == 0) {
        uVar9 = (ulong)piVar31 >> 0x3e | (long)piVar32 << 2;
        piVar29 = (int64_t *)(uStack_1c8 * lStack_180 + uVar9);
        piVar24 = (int64_t *)
                  (SUB168(SEXT816((long)uStack_1c8) * SEXT816(lStack_180),8) +
                   ((long)piVar32 >> 0x3e) + (ulong)CARRY8(uStack_1c8 * lStack_180,uVar9));
        uVar9 = (long)piStack_1c0 * (long)piStack_168;
        lVar19 = SUB168(SEXT816((long)piStack_1c0) * SEXT816((long)piStack_168),8);
        piVar32 = piStack_168;
        if (lVar19 < 0) goto LAB_00149b1c;
        piVar17 = (int64_t *)(-1 - uVar9);
        lVar18 = (0x7fffffffffffffff - lVar19) - (long)piVar24;
        psVar40 = (secp256k1_modinv64_signed62 *)(lVar18 - (ulong)(piVar17 < piVar29));
        if ((SBORROW8(0x7fffffffffffffff - lVar19,(long)piVar24) !=
            SBORROW8(lVar18,(ulong)(piVar17 < piVar29))) != (long)psVar40 < 0) goto LAB_00149b41;
        goto LAB_00149a02;
      }
      goto LAB_0014a210;
    }
  }
  iVar4 = (int)uVar25;
  psStack_1e0 = (secp256k1_modinv64_signed62 *)secp256k1_modinv64_mul_cmp_62;
  secp256k1_modinv64_update_de_62_cold_27();
  psVar40 = &sStack_240;
  piStack_1f0 = piVar23;
  piStack_1e8 = a_00;
  psStack_1e0 = psVar14;
  secp256k1_modinv64_mul_62(&sStack_218,(secp256k1_modinv64_signed62 *)piVar17,iVar4,1);
  psVar14 = a;
  secp256k1_modinv64_mul_62(&sStack_240,a,5,(int64_t)psVar15);
  lVar39 = 0;
  while ((ulong)sStack_218.v[lVar39] < 0x4000000000000000) {
    if (0x3fffffffffffffff < (ulong)sStack_240.v[lVar39]) goto LAB_0014a2d7;
    lVar39 = lVar39 + 1;
    if (lVar39 == 4) {
      uVar16 = 4;
      while( true ) {
        if (sStack_218.v[uVar16] < sStack_240.v[uVar16]) {
          return;
        }
        if (sStack_240.v[uVar16] < sStack_218.v[uVar16]) break;
        bVar41 = uVar16 == 0;
        uVar16 = uVar16 - 1;
        if (bVar41) {
          return;
        }
      }
      return;
    }
  }
  secp256k1_modinv64_mul_cmp_62_cold_2();
LAB_0014a2d7:
  secp256k1_modinv64_mul_cmp_62_cold_1();
  iVar4 = (int)psVar40;
  if (iVar4 < 1) {
LAB_0014a584:
    secp256k1_modinv64_update_fg_62_var_cold_9();
LAB_0014a589:
    secp256k1_modinv64_update_fg_62_var_cold_1();
LAB_0014a58e:
    secp256k1_modinv64_update_fg_62_var_cold_2();
LAB_0014a593:
    secp256k1_modinv64_update_fg_62_var_cold_6();
LAB_0014a598:
    secp256k1_modinv64_update_fg_62_var_cold_5();
LAB_0014a59d:
    secp256k1_modinv64_update_fg_62_var_cold_8();
  }
  else {
    lVar39 = psVar15->v[0];
    lVar19 = psVar15->v[1];
    lVar18 = psVar14->v[0];
    lVar26 = *extraout_RDX_09;
    uVar25 = lVar18 * lVar39;
    lVar21 = SUB168(SEXT816(lVar18) * SEXT816(lVar39),8);
    uVar8 = lVar26 * lVar19;
    lVar22 = SUB168(SEXT816(lVar26) * SEXT816(lVar19),8);
    lVar2 = (0x7fffffffffffffff - lVar22) - lVar21;
    if ((SBORROW8(0x7fffffffffffffff - lVar22,lVar21) != SBORROW8(lVar2,(ulong)(~uVar8 < uVar25)))
        != (long)(lVar2 - (ulong)(~uVar8 < uVar25)) < 0 && -1 < lVar22) goto LAB_0014a59d;
    lVar2 = psVar15->v[2];
    lVar1 = psVar15->v[3];
    lVar22 = lVar22 + lVar21 + (ulong)CARRY8(uVar8,uVar25);
    uVar10 = lVar18 * lVar2;
    lVar21 = SUB168(SEXT816(lVar18) * SEXT816(lVar2),8);
    uVar11 = lVar26 * lVar1;
    lVar26 = SUB168(SEXT816(lVar26) * SEXT816(lVar1),8);
    uVar9 = (ulong)(-uVar11 - 1 < uVar10);
    lVar18 = (0x7fffffffffffffff - lVar26) - lVar21;
    if ((SBORROW8(0x7fffffffffffffff - lVar26,lVar21) != SBORROW8(lVar18,uVar9)) ==
        (long)(lVar18 - uVar9) < 0 || lVar26 < 0) {
      lVar18 = lVar26 + lVar21 + (ulong)CARRY8(uVar11,uVar10);
      if ((uVar8 + uVar25 & 0x3fffffffffffffff) != 0) goto LAB_0014a589;
      if ((uVar11 + uVar10 & 0x3fffffffffffffff) != 0) goto LAB_0014a58e;
      uVar9 = uVar11 + uVar10 >> 0x3e | lVar18 * 4;
      uVar25 = uVar8 + uVar25 >> 0x3e | lVar22 * 4;
      lVar18 = lVar18 >> 0x3e;
      lVar22 = lVar22 >> 0x3e;
      if (iVar4 != 1) {
        psVar40 = (secp256k1_modinv64_signed62 *)((ulong)psVar40 & 0xffffffff);
        psVar15 = (secp256k1_modinv64_signed62 *)0x1;
        do {
          lVar26 = psVar14->v[(long)psVar15];
          uVar10 = lVar26 * lVar39 + uVar25;
          lVar35 = SUB168(SEXT816(lVar26) * SEXT816(lVar39),8) + lVar22 +
                   (ulong)CARRY8(lVar26 * lVar39,uVar25);
          lVar21 = extraout_RDX_09[(long)psVar15];
          uVar8 = lVar21 * lVar19;
          lVar22 = SUB168(SEXT816(lVar21) * SEXT816(lVar19),8);
          if (lVar22 < 0) {
            lVar37 = (-0x8000000000000000 - lVar22) - (ulong)(uVar8 != 0);
            lVar3 = lVar35 - lVar37;
            if ((SBORROW8(lVar35,lVar37) != SBORROW8(lVar3,(ulong)(uVar10 < -uVar8))) ==
                (long)(lVar3 - (ulong)(uVar10 < -uVar8)) < 0) goto LAB_0014a473;
LAB_0014a57a:
            secp256k1_modinv64_update_fg_62_var_cold_4();
LAB_0014a57f:
            secp256k1_modinv64_update_fg_62_var_cold_3();
            goto LAB_0014a584;
          }
          uVar25 = (ulong)(-uVar8 - 1 < uVar10);
          lVar3 = (0x7fffffffffffffff - lVar22) - lVar35;
          if ((SBORROW8(0x7fffffffffffffff - lVar22,lVar35) != SBORROW8(lVar3,uVar25)) !=
              (long)(lVar3 - uVar25) < 0) goto LAB_0014a57a;
LAB_0014a473:
          lVar22 = lVar35 + lVar22 + (ulong)CARRY8(uVar10,uVar8);
          uVar38 = lVar26 * lVar2 + uVar9;
          lVar26 = SUB168(SEXT816(lVar26) * SEXT816(lVar2),8) + lVar18 +
                   (ulong)CARRY8(lVar26 * lVar2,uVar9);
          uVar11 = lVar21 * lVar1;
          lVar18 = SUB168(SEXT816(lVar21) * SEXT816(lVar1),8);
          if (lVar18 < 0) {
            lVar35 = (-0x8000000000000000 - lVar18) - (ulong)(uVar11 != 0);
            lVar21 = lVar26 - lVar35;
            if ((SBORROW8(lVar26,lVar35) != SBORROW8(lVar21,(ulong)(uVar38 < -uVar11))) !=
                (long)(lVar21 - (ulong)(uVar38 < -uVar11)) < 0) goto LAB_0014a57f;
          }
          else {
            uVar25 = (ulong)(-uVar11 - 1 < uVar38);
            lVar21 = (0x7fffffffffffffff - lVar18) - lVar26;
            if ((SBORROW8(0x7fffffffffffffff - lVar18,lVar26) != SBORROW8(lVar21,uVar25)) !=
                (long)(lVar21 - uVar25) < 0) goto LAB_0014a57f;
          }
          lVar18 = lVar26 + lVar18 + (ulong)CARRY8(uVar38,uVar11);
          uVar25 = lVar22 * 4 | uVar10 + uVar8 >> 0x3e;
          psVar14->v[(long)((long)psVar15[-1].v + 0x27)] = uVar10 + uVar8 & 0x3fffffffffffffff;
          uVar9 = lVar18 * 4 | uVar38 + uVar11 >> 0x3e;
          extraout_RDX_09[(long)((long)psVar15[-1].v + 0x27)] = uVar38 + uVar11 & 0x3fffffffffffffff
          ;
          psVar15 = (secp256k1_modinv64_signed62 *)((long)psVar15->v + 1);
          lVar18 = lVar18 >> 0x3e;
          lVar22 = lVar22 >> 0x3e;
        } while (psVar40 != psVar15);
      }
      if (lVar22 + -1 + (ulong)(0x7fffffffffffffff < uVar25) != -1) goto LAB_0014a593;
      psVar14->v[(long)iVar4 + -1] = uVar25;
      if (lVar18 + -1 + (ulong)(0x7fffffffffffffff < uVar9) == -1) {
        extraout_RDX_09[(long)iVar4 + -1] = uVar9;
        return;
      }
      goto LAB_0014a598;
    }
  }
  secp256k1_modinv64_update_fg_62_var_cold_7();
  lVar39 = psVar40->v[0];
  lVar19 = psVar40->v[1];
  lVar18 = psVar40->v[2];
  lVar26 = psVar40->v[3];
  lVar2 = psVar40->v[4];
  lVar21 = 0;
  do {
    if (psVar40->v[lVar21] < -0x3fffffffffffffff) {
      secp256k1_modinv64_normalize_62_cold_7();
LAB_0014a7d3:
      secp256k1_modinv64_normalize_62_cold_6();
      goto LAB_0014a7d8;
    }
    if (0x3fffffffffffffff < psVar40->v[lVar21]) goto LAB_0014a7d3;
    lVar21 = lVar21 + 1;
  } while (lVar21 != 5);
  iVar4 = secp256k1_modinv64_mul_cmp_62(psVar40,5,b,-2);
  if (iVar4 < 1) {
LAB_0014a7d8:
    secp256k1_modinv64_normalize_62_cold_5();
LAB_0014a7dd:
    secp256k1_modinv64_normalize_62_cold_4();
LAB_0014a7e2:
    secp256k1_modinv64_normalize_62_cold_3();
  }
  else {
    iVar4 = secp256k1_modinv64_mul_cmp_62(psVar40,5,b,1);
    if (-1 < iVar4) goto LAB_0014a7dd;
    uVar25 = lVar2 >> 0x3f;
    uVar10 = (long)psVar14 >> 0x3f;
    uVar8 = ((uVar25 & b->v[0]) + lVar39 ^ uVar10) - uVar10;
    uVar11 = ((long)uVar8 >> 0x3e) + (((uVar25 & b->v[1]) + lVar19 ^ uVar10) - uVar10);
    uVar38 = ((long)uVar11 >> 0x3e) + ((lVar18 + (uVar25 & b->v[2]) ^ uVar10) - uVar10);
    uVar9 = ((long)uVar38 >> 0x3e) + (((uVar25 & b->v[3]) + lVar26 ^ uVar10) - uVar10);
    lVar39 = ((long)uVar9 >> 0x3e) + (((uVar25 & b->v[4]) + lVar2 ^ uVar10) - uVar10);
    uVar10 = lVar39 >> 0x3f;
    uVar25 = (b->v[0] & uVar10) + (uVar8 & 0x3fffffffffffffff);
    uVar11 = ((long)uVar25 >> 0x3e) + (b->v[1] & uVar10) + (uVar11 & 0x3fffffffffffffff);
    uVar8 = ((long)uVar11 >> 0x3e) + (b->v[2] & uVar10) + (uVar38 & 0x3fffffffffffffff);
    uVar9 = ((long)uVar8 >> 0x3e) + (b->v[3] & uVar10) + (uVar9 & 0x3fffffffffffffff);
    uVar10 = (b->v[4] & uVar10) + lVar39 + ((long)uVar9 >> 0x3e);
    psVar40->v[0] = uVar25 & 0x3fffffffffffffff;
    psVar40->v[1] = uVar11 & 0x3fffffffffffffff;
    psVar40->v[2] = uVar8 & 0x3fffffffffffffff;
    psVar40->v[3] = uVar9 & 0x3fffffffffffffff;
    psVar40->v[4] = uVar10;
    if (0x3fffffffffffffff < uVar10) goto LAB_0014a7e2;
    iVar4 = secp256k1_modinv64_mul_cmp_62(psVar40,5,b,0);
    if (-1 < iVar4) {
      iVar4 = secp256k1_modinv64_mul_cmp_62(psVar40,5,b,1);
      if (iVar4 < 0) {
        return;
      }
      goto LAB_0014a7ec;
    }
  }
  secp256k1_modinv64_normalize_62_cold_2();
LAB_0014a7ec:
  secp256k1_modinv64_normalize_62_cold_1();
  return;
}

Assistant:

static void secp256k1_modinv64_var(secp256k1_modinv64_signed62 *x, const secp256k1_modinv64_modinfo *modinfo) {
    /* Start with d=0, e=1, f=modulus, g=x, eta=-1. */
    secp256k1_modinv64_signed62 d = {{0, 0, 0, 0, 0}};
    secp256k1_modinv64_signed62 e = {{1, 0, 0, 0, 0}};
    secp256k1_modinv64_signed62 f = modinfo->modulus;
    secp256k1_modinv64_signed62 g = *x;
#ifdef VERIFY
    int i = 0;
#endif
    int j, len = 5;
    int64_t eta = -1; /* eta = -delta; delta is initially 1 */
    int64_t cond, fn, gn;

    /* Do iterations of 62 divsteps each until g=0. */
    while (1) {
        /* Compute transition matrix and new eta after 62 divsteps. */
        secp256k1_modinv64_trans2x2 t;
        eta = secp256k1_modinv64_divsteps_62_var(eta, f.v[0], g.v[0], &t);
        /* Update d,e using that transition matrix. */
        secp256k1_modinv64_update_de_62(&d, &e, &t, modinfo);
        /* Update f,g using that transition matrix. */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, -1) > 0); /* f > -modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, -1) > 0); /* g > -modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, 1) < 0);  /* g <  modulus */

        secp256k1_modinv64_update_fg_62_var(len, &f, &g, &t);
        /* If the bottom limb of g is zero, there is a chance that g=0. */
        if (g.v[0] == 0) {
            cond = 0;
            /* Check if the other limbs are also 0. */
            for (j = 1; j < len; ++j) {
                cond |= g.v[j];
            }
            /* If so, we're done. */
            if (cond == 0) break;
        }

        /* Determine if len>1 and limb (len-1) of both f and g is 0 or -1. */
        fn = f.v[len - 1];
        gn = g.v[len - 1];
        cond = ((int64_t)len - 2) >> 63;
        cond |= fn ^ (fn >> 63);
        cond |= gn ^ (gn >> 63);
        /* If so, reduce length, propagating the sign of f and g's top limb into the one below. */
        if (cond == 0) {
            f.v[len - 2] |= (uint64_t)fn << 62;
            g.v[len - 2] |= (uint64_t)gn << 62;
            --len;
        }

        VERIFY_CHECK(++i < 12); /* We should never need more than 12*62 = 744 divsteps */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, -1) > 0); /* f > -modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, -1) > 0); /* g > -modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, 1) < 0);  /* g <  modulus */
    }

    /* At this point g is 0 and (if g was not originally 0) f must now equal +/- GCD of
     * the initial f, g values i.e. +/- 1, and d now contains +/- the modular inverse. */

    /* g == 0 */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &SECP256K1_SIGNED62_ONE, 0) == 0);
    /* |f| == 1, or (x == 0 and d == 0 and f == modulus) */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &SECP256K1_SIGNED62_ONE, -1) == 0 ||
                 secp256k1_modinv64_mul_cmp_62(&f, len, &SECP256K1_SIGNED62_ONE, 1) == 0 ||
                 (secp256k1_modinv64_mul_cmp_62(x, 5, &SECP256K1_SIGNED62_ONE, 0) == 0 &&
                  secp256k1_modinv64_mul_cmp_62(&d, 5, &SECP256K1_SIGNED62_ONE, 0) == 0 &&
                  secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 1) == 0));

    /* Optionally negate d, normalize to [0,modulus), and return it. */
    secp256k1_modinv64_normalize_62(&d, f.v[len - 1], modinfo);
    *x = d;
}